

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  WhereConst *pWVar2;
  Parse *pPVar3;
  int *piVar4;
  AggInfo *pInfo;
  char *pcVar5;
  anon_union_8_3_c79b3df9_for_y *paVar6;
  AggInfo_func *pAVar7;
  FuncDef *pFVar8;
  int iVar9;
  int local_a4;
  AggInfo_func *pAStack_88;
  u8 enc;
  AggInfo_func *pItem_1;
  Expr *pE;
  ExprList_item *pTerm;
  ExprList *pGB;
  int local_60;
  int n;
  int j;
  int k;
  AggInfo_col *pCol;
  SrcList_item *pItem;
  AggInfo *pAggInfo;
  SrcList *pSrcList;
  Parse *pParse;
  NameContext *pNC;
  int i;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  pWVar2 = (pWalker->u).pConst;
  pPVar3 = pWVar2->pParse;
  piVar4 = *(int **)&pWVar2->nConst;
  pInfo = (AggInfo *)pWVar2->apExpr;
  uVar1 = pExpr->op;
  if (uVar1 != 0xa2) {
    if (uVar1 == 0xa3) {
      if ((((ulong)pWVar2[1].apExpr & 8) == 0) && (pWalker->walkerDepth == (uint)pExpr->op2)) {
        pAStack_88 = pInfo->aFunc;
        pNC._4_4_ = 0;
        while ((pNC._4_4_ < pInfo->nFunc &&
               (iVar9 = sqlite3ExprCompare((Parse *)0x0,pAStack_88->pExpr,pExpr,-1), iVar9 != 0))) {
          pNC._4_4_ = pNC._4_4_ + 1;
          pAStack_88 = pAStack_88 + 1;
        }
        if (pInfo->nFunc <= pNC._4_4_) {
          uVar1 = pPVar3->db->enc;
          pNC._4_4_ = addAggInfoFunc(pPVar3->db,pInfo);
          if (-1 < pNC._4_4_) {
            pAVar7 = pInfo->aFunc + pNC._4_4_;
            pAVar7->pExpr = pExpr;
            iVar9 = pPVar3->nMem + 1;
            pPVar3->nMem = iVar9;
            pAVar7->iMem = iVar9;
            if ((pExpr->x).pList == (ExprList *)0x0) {
              local_a4 = 0;
            }
            else {
              local_a4 = ((pExpr->x).pList)->nExpr;
            }
            pFVar8 = sqlite3FindFunction(pPVar3->db,(pExpr->u).zToken,local_a4,uVar1,'\0');
            pAVar7->pFunc = pFVar8;
            if ((pExpr->flags & 2) == 0) {
              pAVar7->iDistinct = -1;
            }
            else {
              iVar9 = pPVar3->nTab;
              pPVar3->nTab = iVar9 + 1;
              pAVar7->iDistinct = iVar9;
            }
          }
        }
        pExpr->iAgg = (i16)pNC._4_4_;
        pExpr->pAggInfo = pInfo;
        return 1;
      }
      return 0;
    }
    if (uVar1 != 0xa4) {
      return 0;
    }
  }
  if (piVar4 == (int *)0x0) {
    return 1;
  }
  pCol = (AggInfo_col *)(piVar4 + 2);
  pNC._4_4_ = 0;
  while( true ) {
    if (*piVar4 <= pNC._4_4_) {
      return 1;
    }
    if (pExpr->iTable == *(int *)&pCol[2].pTab) break;
    pNC._4_4_ = pNC._4_4_ + 1;
    pCol = (AggInfo_col *)&pCol[3].iSorterColumn;
  }
  _j = pInfo->aCol;
  n = 0;
  for (; (n < pInfo->nColumn &&
         ((_j->iTable != pExpr->iTable || (_j->iColumn != (int)pExpr->iColumn)))); _j = _j + 1) {
    n = n + 1;
  }
  if ((pInfo->nColumn <= n) && (n = addAggInfoColumn(pPVar3->db,pInfo), -1 < n)) {
    paVar6 = (anon_union_8_3_c79b3df9_for_y *)(pInfo->aCol + n);
    *paVar6 = pExpr->y;
    paVar6[1].sub.iAddr = pExpr->iTable;
    *(int *)((long)paVar6 + 0xc) = (int)pExpr->iColumn;
    iVar9 = pPVar3->nMem + 1;
    pPVar3->nMem = iVar9;
    *(int *)((long)paVar6 + 0x14) = iVar9;
    paVar6[2].sub.iAddr = -1;
    paVar6[3].pTab = (Table *)pExpr;
    if (pInfo->pGroupBy != (ExprList *)0x0) {
      pE = (Expr *)pInfo->pGroupBy->a;
      for (local_60 = 0; local_60 < pInfo->pGroupBy->nExpr; local_60 = local_60 + 1) {
        pcVar5 = *(char **)pE;
        if (((*pcVar5 == -0x5e) && (*(int *)(pcVar5 + 0x2c) == pExpr->iTable)) &&
           (*(short *)(pcVar5 + 0x30) == pExpr->iColumn)) {
          paVar6[2].sub.iAddr = local_60;
          break;
        }
        pE = (Expr *)&pE->x;
      }
    }
    if (paVar6[2].sub.iAddr < 0) {
      iVar9 = pInfo->nSortingColumn;
      pInfo->nSortingColumn = iVar9 + 1;
      paVar6[2].sub.iAddr = iVar9;
    }
  }
  pExpr->pAggInfo = pInfo;
  pExpr->op = 0xa4;
  pExpr->iAgg = (i16)n;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        struct SrcList_item *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.  
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable &&
                  pCol->iColumn==pExpr->iColumn ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0 
            ){
              pCol = &pAggInfo->aCol[k];
              pCol->pTab = pExpr->y.pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pExpr = pExpr;
              if( pAggInfo->pGroupBy ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN && pE->iTable==pExpr->iTable &&
                      pE->iColumn==pExpr->iColumn ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            pExpr->op = TK_AGG_COLUMN;
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate 
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( sqlite3ExprCompare(0, pItem->pExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( !ExprHasProperty(pExpr, EP_IntValue) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken, 
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}